

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_1InferenceAnd3TrainingInputs(void)

{
  string *psVar1;
  bool bVar2;
  TypeUnion TVar3;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  Type *pTVar7;
  ArrayFeatureType *pAVar8;
  ostream *poVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  Model spec;
  string softmaxOutputName;
  string targetName;
  Result res;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  undefined1 local_198 [24];
  Model local_180;
  string local_150;
  string local_130;
  pointer local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  TensorAttributes local_58;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_180);
  CoreML::Result::Result((Result *)&local_110);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_58.name = "OutTensor";
  local_58.dimension = 1;
  local_58._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_180,true,&local_48,&local_58,0x400,false,false);
  local_180.specificationversion_ = 4;
  if (local_180._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_180);
    local_180._oneof_case_[0] = 500;
    TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
    local_180.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
  }
  TVar3 = local_180.Type_;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"softmax_out","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"cce_target","");
  addSoftmaxLayer(&local_180,"softmax","OutTensor",local_150._M_dataplus._M_p);
  this = (TVar3.neuralnetworkregressor_)->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    (TVar3.neuralnetworkregressor_)->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"cross_entropy_loss_layer","")
  ;
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198._0_8_ + 1);
  }
  if (this_00->_oneof_case_[0] == 10) {
    this_01 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 10;
    this_01 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (this_01);
    (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = this_01;
  }
  psVar1 = (this_01->input_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this_01->input_,&local_150);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  psVar1 = (this_01->target_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this_01->target_,&local_130);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b8);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_e8);
  if (local_180.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_180.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_180.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"madeUpInput","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198._0_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar6->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10020;
  iVar11 = (pAVar8->shape_).current_size_;
  iVar12 = 3;
  do {
    if (iVar11 == (pAVar8->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar11 + 1);
      iVar11 = (pAVar8->shape_).current_size_;
    }
    lVar10 = (long)iVar11;
    iVar11 = iVar11 + 1;
    (pAVar8->shape_).current_size_ = iVar11;
    ((pAVar8->shape_).rep_)->elements[lVar10] = 1;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_180.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_180.description_ = pMVar4;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_180.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"madeUpInput2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198._0_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar6->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10020;
  iVar11 = (pAVar8->shape_).current_size_;
  iVar12 = 3;
  do {
    if (iVar11 == (pAVar8->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar11 + 1);
      iVar11 = (pAVar8->shape_).current_size_;
    }
    lVar10 = (long)iVar11;
    iVar11 = iVar11 + 1;
    (pAVar8->shape_).current_size_ = iVar11;
    ((pAVar8->shape_).rep_)->elements[lVar10] = 1;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_180.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_180.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_180.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar1 = (pTVar5->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar5->name_,(this_01->target_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar6->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x20020;
  iVar11 = (pAVar8->shape_).current_size_;
  if (iVar11 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar11 + 1);
    iVar11 = (pAVar8->shape_).current_size_;
  }
  (pAVar8->shape_).current_size_ = iVar11 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar11] = 1;
  CoreML::Model::validate((Result *)local_1a8,&local_180);
  local_110 = (pointer)local_1a8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&local_1a0);
  if (local_1a0._M_p != local_198 + 8) {
    operator_delete(local_1a0._M_p,local_198._8_8_ + 1);
  }
  bVar2 = CoreML::Result::good((Result *)&local_110);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x876);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_180);
  return (uint)!bVar2;
}

Assistant:

int testValid_1InferenceAnd3TrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }
    auto fakeModelInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput2->set_name("madeUpInput2");
    auto fakeModelInputShape2 = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape2->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape2->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}